

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  seqDef *psVar18;
  ulong *puVar19;
  int iVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  uint uVar24;
  BYTE *pStart_3;
  int iVar25;
  long lVar26;
  ulong uVar27;
  U32 UVar28;
  BYTE *pBVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong *puVar32;
  BYTE *pBVar33;
  uint uVar34;
  long lVar35;
  uint uVar36;
  ulong *puVar37;
  uint uVar38;
  ulong uVar39;
  BYTE *pInLoopLimit;
  BYTE *pStart;
  uint local_74;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar31 = (ulong *)((long)src + (srcSize - 8));
  pBVar29 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar37 = (ulong *)((ulong)((int)src == (int)pBVar29) + (long)src);
  uVar34 = (int)puVar37 - (int)pBVar29;
  uVar24 = uVar5;
  if (uVar34 < uVar5) {
    uVar24 = 0;
  }
  uVar27 = (ulong)uVar24;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar17 = (ulong)uVar6;
  if (uVar34 < uVar6) {
    uVar17 = 0;
  }
  uVar11 = (uint)uVar17;
  if (puVar37 < puVar31) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    do {
      local_74 = (uint)uVar27;
      uVar24 = (uint)uVar17;
      lVar26 = -uVar17;
      if (uVar24 == 0) {
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        if (*(int *)((long)((long)puVar37 + 1U) - uVar17) == *(int *)((long)puVar37 + 1)) {
          puVar32 = (ulong *)((long)puVar37 + 5);
          puVar14 = (ulong *)((long)puVar37 + lVar26 + 5);
          puVar19 = puVar32;
          if (puVar32 < puVar1) {
            if (*puVar14 == *puVar32) {
              lVar21 = 0;
              do {
                puVar19 = (ulong *)((long)puVar37 + lVar21 + 0xd);
                if (puVar1 <= puVar19) {
                  puVar14 = (ulong *)((long)puVar37 + lVar26 + lVar21 + 0xd);
                  puVar19 = (ulong *)((long)puVar37 + lVar21 + 0xd);
                  goto LAB_004dc7c9;
                }
                uVar23 = *(ulong *)((long)puVar37 + lVar21 + lVar26 + 0xd);
                uVar30 = *puVar19;
                lVar21 = lVar21 + 8;
              } while (uVar23 == uVar30);
              uVar30 = uVar30 ^ uVar23;
              uVar23 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar21;
            }
            else {
              uVar30 = *puVar32 ^ *puVar14;
              uVar23 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004dc7c9:
            if ((puVar19 < puVar2) && ((int)*puVar14 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar14 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar14 == (char)*puVar19));
            }
            uVar23 = (long)puVar19 - (long)puVar32;
          }
          uVar23 = uVar23 + 4;
        }
      }
      uVar11 = (ms->cParams).minMatch;
      UVar28 = (U32)puVar37;
      if (uVar11 - 6 < 2) {
        uVar11 = (ms->cParams).chainLog;
        uVar36 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar33 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar38 = UVar28 - (int)pBVar33;
        uVar9 = uVar38 - uVar36;
        if (uVar38 < uVar36) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
        if (uVar13 < uVar11) {
          iVar20 = 1 << ((byte)uVar7 & 0x1f);
          uVar30 = 999999999;
          uVar39 = 3;
          do {
            puVar32 = (ulong *)(pBVar33 + uVar11);
            if (*(char *)(uVar39 + (long)puVar32) == *(char *)((long)puVar37 + uVar39)) {
              puVar19 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar32 == *puVar37) {
                  lVar21 = (ulong)uVar11 + 8;
                  lVar35 = 0;
                  do {
                    puVar19 = (ulong *)((long)puVar37 + lVar35 + 8);
                    if (puVar1 <= puVar19) {
                      puVar32 = (ulong *)(pBVar33 + lVar35 + lVar21);
                      goto LAB_004dc951;
                    }
                    lVar10 = lVar35 + lVar21;
                    lVar35 = lVar35 + 8;
                  } while (*(ulong *)(pBVar33 + lVar10) == *puVar19);
                  uVar15 = *puVar19 ^ *(ulong *)(pBVar33 + lVar10);
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar15 = *puVar37 ^ *puVar32;
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004dc951:
                if ((puVar19 < puVar2) && ((int)*puVar32 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar19 < puVar3) && ((short)*puVar32 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar19 < puVar4) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar32 == (char)*puVar19));
                }
                uVar16 = (long)puVar19 - (long)puVar37;
              }
              if ((uVar39 < uVar16) &&
                 (uVar30 = (ulong)((uVar38 + 2) - uVar11), uVar39 = uVar16,
                 (ulong *)((long)puVar37 + uVar16) == puVar4)) goto LAB_004dcd47;
            }
            uVar16 = uVar39;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
                (iVar20 = iVar20 + -1, uVar39 = uVar16, iVar20 == 0)))) goto LAB_004dcd47;
          } while( true );
        }
      }
      else if (uVar11 == 5) {
        uVar11 = (ms->cParams).chainLog;
        uVar36 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar33 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar38 = UVar28 - (int)pBVar33;
        uVar9 = uVar38 - uVar36;
        if (uVar38 < uVar36) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
        if (uVar13 < uVar11) {
          iVar20 = 1 << ((byte)uVar7 & 0x1f);
          uVar30 = 999999999;
          uVar39 = 3;
          do {
            puVar32 = (ulong *)(pBVar33 + uVar11);
            if (*(char *)(uVar39 + (long)puVar32) == *(char *)((long)puVar37 + uVar39)) {
              puVar19 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar32 == *puVar37) {
                  lVar21 = (ulong)uVar11 + 8;
                  lVar35 = 0;
                  do {
                    puVar19 = (ulong *)((long)puVar37 + lVar35 + 8);
                    if (puVar1 <= puVar19) {
                      puVar32 = (ulong *)(pBVar33 + lVar35 + lVar21);
                      goto LAB_004dcb04;
                    }
                    lVar10 = lVar35 + lVar21;
                    lVar35 = lVar35 + 8;
                  } while (*(ulong *)(pBVar33 + lVar10) == *puVar19);
                  uVar15 = *puVar19 ^ *(ulong *)(pBVar33 + lVar10);
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar15 = *puVar37 ^ *puVar32;
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004dcb04:
                if ((puVar19 < puVar2) && ((int)*puVar32 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar19 < puVar3) && ((short)*puVar32 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar19 < puVar4) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar32 == (char)*puVar19));
                }
                uVar16 = (long)puVar19 - (long)puVar37;
              }
              if ((uVar39 < uVar16) &&
                 (uVar30 = (ulong)((uVar38 + 2) - uVar11), uVar39 = uVar16,
                 (ulong *)((long)puVar37 + uVar16) == puVar4)) goto LAB_004dcd47;
            }
            uVar16 = uVar39;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
                (iVar20 = iVar20 + -1, uVar39 = uVar16, iVar20 == 0)))) goto LAB_004dcd47;
          } while( true );
        }
      }
      else {
        uVar11 = (ms->cParams).chainLog;
        uVar36 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar33 = (ms->window).base;
        uVar13 = (ms->window).lowLimit;
        uVar38 = UVar28 - (int)pBVar33;
        uVar9 = uVar38 - uVar36;
        if (uVar38 < uVar36) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
        if (uVar13 < uVar11) {
          iVar20 = 1 << ((byte)uVar7 & 0x1f);
          uVar30 = 999999999;
          uVar39 = 3;
          do {
            puVar32 = (ulong *)(pBVar33 + uVar11);
            if (*(char *)(uVar39 + (long)puVar32) == *(char *)((long)puVar37 + uVar39)) {
              puVar19 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar32 == *puVar37) {
                  lVar21 = (ulong)uVar11 + 8;
                  lVar35 = 0;
                  do {
                    puVar19 = (ulong *)((long)puVar37 + lVar35 + 8);
                    if (puVar1 <= puVar19) {
                      puVar32 = (ulong *)(pBVar33 + lVar35 + lVar21);
                      goto LAB_004dcca9;
                    }
                    lVar10 = lVar35 + lVar21;
                    lVar35 = lVar35 + 8;
                  } while (*(ulong *)(pBVar33 + lVar10) == *puVar19);
                  uVar15 = *puVar19 ^ *(ulong *)(pBVar33 + lVar10);
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar15 = *puVar37 ^ *puVar32;
                  uVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004dcca9:
                if ((puVar19 < puVar2) && ((int)*puVar32 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar19 < puVar3) && ((short)*puVar32 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar19 < puVar4) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar32 == (char)*puVar19));
                }
                uVar16 = (long)puVar19 - (long)puVar37;
              }
              if ((uVar39 < uVar16) &&
                 (uVar30 = (ulong)((uVar38 + 2) - uVar11), uVar39 = uVar16,
                 (ulong *)((long)puVar37 + uVar16) == puVar4)) goto LAB_004dcd47;
            }
            uVar16 = uVar39;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
                (iVar20 = iVar20 + -1, uVar39 = uVar16, iVar20 == 0)))) goto LAB_004dcd47;
          } while( true );
        }
      }
      uVar16 = 3;
      uVar30 = 999999999;
LAB_004dcd47:
      uVar39 = uVar23;
      if (uVar23 < uVar16) {
        uVar39 = uVar16;
      }
      if (uVar39 < 4) {
        puVar37 = (ulong *)((long)puVar37 + ((long)puVar37 - (long)src >> 8) + 1);
      }
      else {
        puVar32 = puVar37;
        if (uVar16 <= uVar23) {
          uVar30 = 0;
          puVar32 = (ulong *)((long)puVar37 + 1U);
        }
        if (puVar37 < puVar31) {
LAB_004dcdb9:
          puVar19 = (ulong *)((long)puVar37 + 1);
          if (uVar30 == 0) {
            uVar30 = 0;
          }
          else if ((uVar24 != 0) && (*(int *)puVar19 == *(int *)((long)puVar19 + lVar26))) {
            puVar14 = (ulong *)((long)puVar37 + 5);
            puVar22 = (ulong *)((long)puVar37 + lVar26 + 5);
            puVar12 = puVar14;
            if (puVar14 < puVar1) {
              if (*puVar22 == *puVar14) {
                puVar12 = (ulong *)((long)puVar37 + 0xd);
                do {
                  if (puVar1 <= puVar12) {
                    puVar22 = (ulong *)((long)puVar12 + lVar26);
                    goto LAB_004dda57;
                  }
                  puVar22 = (ulong *)((long)puVar12 + lVar26);
                  uVar27 = *puVar12;
                  puVar12 = puVar12 + 1;
                } while (*puVar22 == uVar27);
                uVar27 = uVar27 ^ *puVar22;
                uVar17 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                puVar12 = (ulong *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - 8));
                goto LAB_004dda95;
              }
              uVar17 = *puVar14 ^ *puVar22;
              uVar27 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
              uVar13 = (int)uVar30 + 1;
              uVar11 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
            }
            else {
LAB_004dda57:
              if ((puVar12 < puVar2) && ((int)*puVar22 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar12 < puVar3) && ((short)*puVar22 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar12 < puVar4) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar22 == (char)*puVar12));
              }
LAB_004dda95:
              uVar27 = (long)puVar12 - (long)puVar14;
              if (0xfffffffffffffffb < uVar27) goto LAB_004dce3c;
              uVar13 = (int)uVar30 + 1;
              uVar11 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
            }
            if ((int)((uVar11 ^ 0x1f) + (int)uVar39 * 3 + -0x1e) < (int)(uVar27 + 4) * 3) {
              uVar30 = 0;
              puVar32 = puVar19;
              uVar39 = uVar27 + 4;
            }
          }
LAB_004dce3c:
          uVar11 = (ms->cParams).minMatch;
          UVar28 = (U32)puVar19;
          iVar20 = (int)uVar30;
          if (uVar11 - 6 < 2) {
            uVar11 = (ms->cParams).chainLog;
            uVar36 = 1 << ((byte)uVar11 & 0x1f);
            pUVar8 = ms->chainTable;
            pBVar33 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar38 = UVar28 - (int)pBVar33;
            uVar9 = uVar38 - uVar36;
            if (uVar38 < uVar36) {
              uVar9 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                                (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
            if (uVar13 < uVar11) {
              iVar25 = 1 << ((byte)uVar7 & 0x1f);
              uVar17 = 999999999;
              uVar27 = 3;
              do {
                puVar14 = (ulong *)(pBVar33 + uVar11);
                if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
                  puVar12 = puVar19;
                  if (puVar19 < puVar1) {
                    if (*puVar14 == *puVar19) {
                      lVar21 = (ulong)uVar11 + 8;
                      lVar35 = 0;
                      do {
                        puVar12 = (ulong *)((long)puVar37 + lVar35 + 9);
                        if (puVar1 <= puVar12) {
                          puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                          goto LAB_004dcf8f;
                        }
                        lVar10 = lVar35 + lVar21;
                        lVar35 = lVar35 + 8;
                      } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
                      uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
                    }
                    else {
                      uVar16 = *puVar19 ^ *puVar14;
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = uVar23 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_004dcf8f:
                    if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar12 < puVar4) {
                      puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12))
                      ;
                    }
                    uVar23 = (long)puVar12 - (long)puVar19;
                  }
                  if ((uVar27 < uVar23) &&
                     (uVar17 = (ulong)((uVar38 + 2) - uVar11), uVar27 = uVar23,
                     (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd389;
                }
                uVar23 = uVar27;
                if ((uVar11 <= uVar9) ||
                   ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
                    (iVar25 = iVar25 + -1, uVar27 = uVar23, iVar25 == 0)))) goto LAB_004dd389;
              } while( true );
            }
          }
          else if (uVar11 == 5) {
            uVar11 = (ms->cParams).chainLog;
            uVar38 = 1 << ((byte)uVar11 & 0x1f);
            pUVar8 = ms->chainTable;
            pBVar33 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar36 = UVar28 - (int)pBVar33;
            uVar9 = uVar36 - uVar38;
            if (uVar36 < uVar38) {
              uVar9 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                                (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
            if (uVar13 < uVar11) {
              iVar25 = 1 << ((byte)uVar7 & 0x1f);
              uVar17 = 999999999;
              uVar27 = 3;
              do {
                puVar14 = (ulong *)(pBVar33 + uVar11);
                if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
                  puVar12 = puVar19;
                  if (puVar19 < puVar1) {
                    if (*puVar14 == *puVar19) {
                      lVar21 = (ulong)uVar11 + 8;
                      lVar35 = 0;
                      do {
                        puVar12 = (ulong *)((long)puVar37 + lVar35 + 9);
                        if (puVar1 <= puVar12) {
                          puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                          goto LAB_004dd14e;
                        }
                        lVar10 = lVar35 + lVar21;
                        lVar35 = lVar35 + 8;
                      } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
                      uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
                    }
                    else {
                      uVar16 = *puVar19 ^ *puVar14;
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = uVar23 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_004dd14e:
                    if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar12 < puVar4) {
                      puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12))
                      ;
                    }
                    uVar23 = (long)puVar12 - (long)puVar19;
                  }
                  if ((uVar27 < uVar23) &&
                     (uVar17 = (ulong)((uVar36 + 2) - uVar11), uVar27 = uVar23,
                     (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd389;
                }
                uVar23 = uVar27;
                if ((uVar11 <= uVar9) ||
                   ((uVar11 = pUVar8[uVar11 & uVar38 - 1], uVar11 <= uVar13 ||
                    (iVar25 = iVar25 + -1, uVar27 = uVar23, iVar25 == 0)))) goto LAB_004dd389;
              } while( true );
            }
          }
          else {
            uVar11 = (ms->cParams).chainLog;
            uVar38 = 1 << ((byte)uVar11 & 0x1f);
            pUVar8 = ms->chainTable;
            pBVar33 = (ms->window).base;
            uVar13 = (ms->window).lowLimit;
            uVar36 = UVar28 - (int)pBVar33;
            uVar9 = uVar36 - uVar38;
            if (uVar36 < uVar38) {
              uVar9 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                                (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
            if (uVar13 < uVar11) {
              iVar25 = 1 << ((byte)uVar7 & 0x1f);
              uVar17 = 999999999;
              uVar27 = 3;
              do {
                puVar14 = (ulong *)(pBVar33 + uVar11);
                if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
                  puVar12 = puVar19;
                  if (puVar19 < puVar1) {
                    if (*puVar14 == *puVar19) {
                      lVar21 = (ulong)uVar11 + 8;
                      lVar35 = 0;
                      do {
                        puVar12 = (ulong *)((long)puVar37 + lVar35 + 9);
                        if (puVar1 <= puVar12) {
                          puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                          goto LAB_004dd2fd;
                        }
                        lVar10 = lVar35 + lVar21;
                        lVar35 = lVar35 + 8;
                      } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
                      uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
                    }
                    else {
                      uVar16 = *puVar19 ^ *puVar14;
                      uVar23 = 0;
                      if (uVar16 != 0) {
                        for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      uVar23 = uVar23 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_004dd2fd:
                    if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
                      puVar12 = (ulong *)((long)puVar12 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar12 < puVar4) {
                      puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12))
                      ;
                    }
                    uVar23 = (long)puVar12 - (long)puVar19;
                  }
                  if ((uVar27 < uVar23) &&
                     (uVar17 = (ulong)((uVar36 + 2) - uVar11), uVar27 = uVar23,
                     (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd389;
                }
                uVar23 = uVar27;
                if ((uVar11 <= uVar9) ||
                   ((uVar11 = pUVar8[uVar11 & uVar38 - 1], uVar11 <= uVar13 ||
                    (iVar25 = iVar25 + -1, uVar27 = uVar23, iVar25 == 0)))) goto LAB_004dd389;
              } while( true );
            }
          }
          goto LAB_004dd3cc;
        }
LAB_004ddb7c:
        if (uVar30 == 0) {
          UVar28 = 1;
          uVar11 = uVar24;
        }
        else {
          if ((src < puVar32) && (pBVar29 < (BYTE *)((long)puVar32 + (2 - uVar30)))) {
            puVar37 = puVar32;
            while (puVar32 = puVar37,
                  *(char *)((long)puVar37 - 1) == *(char *)((long)puVar37 + (1 - uVar30))) {
              puVar32 = (ulong *)((long)puVar37 - 1);
              uVar39 = uVar39 + 1;
              if ((puVar32 <= src) ||
                 (pBVar33 = (BYTE *)((long)puVar37 + (1 - uVar30)), puVar37 = puVar32,
                 pBVar33 <= pBVar29)) break;
            }
          }
          UVar28 = (int)uVar30 + 1;
          uVar11 = (int)uVar30 - 2;
          local_74 = uVar24;
        }
        uVar17 = (ulong)uVar11;
        uVar23 = (long)puVar32 - (long)src;
        puVar19 = (ulong *)seqStore->lit;
        puVar37 = (ulong *)((long)puVar19 + uVar23);
        do {
          *puVar19 = *src;
          puVar19 = puVar19 + 1;
          src = (void *)((long)src + 8);
        } while (puVar19 < puVar37);
        seqStore->lit = seqStore->lit + uVar23;
        if (uVar23 < 0x10000) {
          psVar18 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar18 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        uVar27 = (ulong)local_74;
        psVar18->litLength = (U16)uVar23;
        psVar18->offset = UVar28;
        if (0xffff < uVar39 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(uVar39 - 3);
        seqStore->sequences = psVar18 + 1;
        puVar37 = (ulong *)((long)puVar32 + uVar39);
        src = puVar37;
        if ((local_74 != 0) && (puVar37 <= puVar31)) {
          while (uVar30 = uVar17, uVar23 = uVar27, uVar17 = uVar30, uVar27 = uVar23, src = puVar37,
                (int)*puVar37 == *(int *)((long)puVar37 - uVar23)) {
            lVar26 = -uVar23;
            puVar32 = (ulong *)((long)puVar37 + 4);
            puVar14 = (ulong *)((long)puVar37 + lVar26 + 4);
            puVar19 = puVar32;
            if (puVar32 < puVar1) {
              if (*puVar14 == *puVar32) {
                lVar21 = 0;
                do {
                  puVar19 = (ulong *)((long)puVar37 + lVar21 + 0xc);
                  if (puVar1 <= puVar19) {
                    puVar14 = (ulong *)((long)puVar37 + lVar26 + lVar21 + 0xc);
                    puVar19 = (ulong *)((long)puVar37 + lVar21 + 0xc);
                    goto LAB_004ddd2d;
                  }
                  uVar27 = *(ulong *)((long)puVar37 + lVar21 + lVar26 + 0xc);
                  uVar17 = *puVar19;
                  lVar21 = lVar21 + 8;
                } while (uVar27 == uVar17);
                uVar17 = uVar17 ^ uVar27;
                uVar27 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar21;
              }
              else {
                uVar17 = *puVar32 ^ *puVar14;
                uVar27 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004ddd2d:
              if ((puVar19 < puVar2) && ((int)*puVar14 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar14 = (ulong *)((long)puVar14 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar14 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar14 = (ulong *)((long)puVar14 + 2);
              }
              if (puVar19 < puVar4) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar14 == (char)*puVar19));
              }
              uVar27 = (long)puVar19 - (long)puVar32;
            }
            *(ulong *)seqStore->lit = *puVar37;
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < uVar27 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(uVar27 + 1);
            seqStore->sequences = psVar18 + 1;
            puVar37 = (ulong *)((long)puVar37 + uVar27 + 4);
            uVar17 = uVar23;
            uVar27 = uVar30;
            src = puVar37;
            if (((int)uVar30 == 0) || (puVar31 < puVar37)) break;
          }
        }
      }
      uVar24 = (uint)uVar27;
      uVar11 = (uint)uVar17;
    } while (puVar37 < puVar31);
  }
  uVar13 = 0;
  if (uVar34 < uVar5) {
    uVar13 = uVar5;
  }
  if (uVar34 < uVar6) {
    uVar13 = uVar6;
  }
  if (uVar11 == 0) {
    uVar11 = uVar13;
  }
  if (uVar24 != 0) {
    uVar13 = uVar24;
  }
  *rep = uVar11;
  rep[1] = uVar13;
  return (long)puVar4 - (long)src;
LAB_004dd389:
  if (3 < uVar23) {
    uVar11 = 0x1f;
    if (iVar20 + 1U != 0) {
      for (; iVar20 + 1U >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar13 = (int)uVar17 + 1;
    iVar25 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    if ((int)((uVar11 ^ 0x1f) + (int)uVar39 * 4 + -0x1b) < (int)uVar23 * 4 - iVar25)
    goto LAB_004dd9f4;
  }
LAB_004dd3cc:
  if (puVar31 <= puVar19) goto LAB_004ddb7c;
  puVar19 = (ulong *)((long)puVar37 + 2);
  if (uVar30 == 0) {
    uVar30 = 0;
    goto LAB_004dd475;
  }
  if ((uVar24 == 0) || (*(int *)puVar19 != *(int *)((long)puVar19 + lVar26))) goto LAB_004dd475;
  puVar14 = (ulong *)((long)puVar37 + 6);
  puVar22 = (ulong *)((long)puVar37 + lVar26 + 6);
  puVar12 = puVar14;
  if (puVar14 < puVar1) {
    if (*puVar22 == *puVar14) {
      puVar12 = (ulong *)((long)puVar37 + 0xe);
      do {
        if (puVar1 <= puVar12) {
          puVar22 = (ulong *)((long)puVar12 + lVar26);
          goto LAB_004ddad9;
        }
        puVar22 = (ulong *)((long)puVar12 + lVar26);
        uVar27 = *puVar12;
        puVar12 = puVar12 + 1;
      } while (*puVar22 == uVar27);
      uVar27 = uVar27 ^ *puVar22;
      uVar17 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      puVar12 = (ulong *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - 8));
      goto LAB_004ddb17;
    }
    uVar17 = *puVar14 ^ *puVar22;
    uVar27 = 0;
    if (uVar17 != 0) {
      for (; (uVar17 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
      }
    }
    uVar27 = uVar27 >> 3 & 0x1fffffff;
    uVar11 = 0x1f;
    if (iVar20 + 1U != 0) {
      for (; iVar20 + 1U >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
  }
  else {
LAB_004ddad9:
    if ((puVar12 < puVar2) && ((int)*puVar22 == (int)*puVar12)) {
      puVar12 = (ulong *)((long)puVar12 + 4);
      puVar22 = (ulong *)((long)puVar22 + 4);
    }
    if ((puVar12 < puVar3) && ((short)*puVar22 == (short)*puVar12)) {
      puVar12 = (ulong *)((long)puVar12 + 2);
      puVar22 = (ulong *)((long)puVar22 + 2);
    }
    if (puVar12 < puVar4) {
      puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar22 == (char)*puVar12));
    }
LAB_004ddb17:
    uVar27 = (long)puVar12 - (long)puVar14;
    if (0xfffffffffffffffb < uVar27) goto LAB_004dd475;
    uVar11 = 0x1f;
    if (iVar20 + 1U != 0) {
      for (; iVar20 + 1U >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
  }
  if ((int)((uVar11 ^ 0x1f) + (int)uVar39 * 4 + -0x1e) < (int)(uVar27 + 4) * 4) {
    uVar30 = 0;
    puVar32 = puVar19;
    uVar39 = uVar27 + 4;
  }
LAB_004dd475:
  uVar11 = (ms->cParams).minMatch;
  UVar28 = (U32)puVar19;
  if (uVar11 - 6 < 2) {
    uVar11 = (ms->cParams).chainLog;
    uVar38 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar33 = (ms->window).base;
    uVar13 = (ms->window).lowLimit;
    uVar36 = UVar28 - (int)pBVar33;
    uVar9 = uVar36 - uVar38;
    if (uVar36 < uVar38) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
    if (uVar13 < uVar11) {
      iVar20 = 1 << ((byte)uVar7 & 0x1f);
      uVar17 = 999999999;
      uVar27 = 3;
      do {
        puVar14 = (ulong *)(pBVar33 + uVar11);
        if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
          puVar12 = puVar19;
          if (puVar19 < puVar1) {
            if (*puVar14 == *puVar19) {
              lVar21 = (ulong)uVar11 + 8;
              lVar35 = 0;
              do {
                puVar12 = (ulong *)((long)puVar37 + lVar35 + 10);
                if (puVar1 <= puVar12) {
                  puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                  goto LAB_004dd5af;
                }
                lVar10 = lVar35 + lVar21;
                lVar35 = lVar35 + 8;
              } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
              uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar16 = *puVar19 ^ *puVar14;
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004dd5af:
            if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar12 < puVar4) {
              puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12));
            }
            uVar23 = (long)puVar12 - (long)puVar19;
          }
          if ((uVar27 < uVar23) &&
             (uVar17 = (ulong)((uVar36 + 2) - uVar11), uVar27 = uVar23,
             (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd9a7;
        }
        uVar23 = uVar27;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar38 - 1], uVar11 <= uVar13 ||
            (iVar20 = iVar20 + -1, uVar27 = uVar23, iVar20 == 0)))) goto LAB_004dd9a7;
      } while( true );
    }
  }
  else if (uVar11 == 5) {
    uVar11 = (ms->cParams).chainLog;
    uVar36 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar33 = (ms->window).base;
    uVar13 = (ms->window).lowLimit;
    uVar38 = UVar28 - (int)pBVar33;
    uVar9 = uVar38 - uVar36;
    if (uVar38 < uVar36) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
    if (uVar13 < uVar11) {
      iVar20 = 1 << ((byte)uVar7 & 0x1f);
      uVar17 = 999999999;
      uVar27 = 3;
      do {
        puVar14 = (ulong *)(pBVar33 + uVar11);
        if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
          puVar12 = puVar19;
          if (puVar19 < puVar1) {
            if (*puVar14 == *puVar19) {
              lVar21 = (ulong)uVar11 + 8;
              lVar35 = 0;
              do {
                puVar12 = (ulong *)((long)puVar37 + lVar35 + 10);
                if (puVar1 <= puVar12) {
                  puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                  goto LAB_004dd76a;
                }
                lVar10 = lVar35 + lVar21;
                lVar35 = lVar35 + 8;
              } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
              uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar16 = *puVar19 ^ *puVar14;
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004dd76a:
            if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar12 < puVar4) {
              puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12));
            }
            uVar23 = (long)puVar12 - (long)puVar19;
          }
          if ((uVar27 < uVar23) &&
             (uVar17 = (ulong)((uVar38 + 2) - uVar11), uVar27 = uVar23,
             (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd9a7;
        }
        uVar23 = uVar27;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
            (iVar20 = iVar20 + -1, uVar27 = uVar23, iVar20 == 0)))) goto LAB_004dd9a7;
      } while( true );
    }
  }
  else {
    uVar11 = (ms->cParams).chainLog;
    uVar36 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar33 = (ms->window).base;
    uVar13 = (ms->window).lowLimit;
    uVar38 = UVar28 - (int)pBVar33;
    uVar9 = uVar38 - uVar36;
    if (uVar38 < uVar36) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar28);
    if (uVar13 < uVar11) {
      iVar20 = 1 << ((byte)uVar7 & 0x1f);
      uVar17 = 999999999;
      uVar27 = 3;
      do {
        puVar14 = (ulong *)(pBVar33 + uVar11);
        if (*(char *)(uVar27 + (long)puVar14) == *(char *)((long)puVar19 + uVar27)) {
          puVar12 = puVar19;
          if (puVar19 < puVar1) {
            if (*puVar14 == *puVar19) {
              lVar21 = (ulong)uVar11 + 8;
              lVar35 = 0;
              do {
                puVar12 = (ulong *)((long)puVar37 + lVar35 + 10);
                if (puVar1 <= puVar12) {
                  puVar14 = (ulong *)(pBVar33 + lVar35 + lVar21);
                  goto LAB_004dd91c;
                }
                lVar10 = lVar35 + lVar21;
                lVar35 = lVar35 + 8;
              } while (*(ulong *)(pBVar33 + lVar10) == *puVar12);
              uVar16 = *puVar12 ^ *(ulong *)(pBVar33 + lVar10);
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar16 = *puVar19 ^ *puVar14;
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004dd91c:
            if ((puVar12 < puVar2) && ((int)*puVar14 == (int)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar12 < puVar3) && ((short)*puVar14 == (short)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar12 < puVar4) {
              puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar14 == (char)*puVar12));
            }
            uVar23 = (long)puVar12 - (long)puVar19;
          }
          if ((uVar27 < uVar23) &&
             (uVar17 = (ulong)((uVar38 + 2) - uVar11), uVar27 = uVar23,
             (ulong *)(uVar23 + (long)puVar19) == puVar4)) goto LAB_004dd9a7;
        }
        uVar23 = uVar27;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar36 - 1], uVar11 <= uVar13 ||
            (iVar20 = iVar20 + -1, uVar27 = uVar23, iVar20 == 0)))) goto LAB_004dd9a7;
      } while( true );
    }
  }
  goto LAB_004ddb7c;
LAB_004dd9a7:
  if (uVar23 < 4) goto LAB_004ddb7c;
  uVar13 = (int)uVar30 + 1;
  uVar11 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar13 = (int)uVar17 + 1;
  iVar20 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar20 == 0; iVar20 = iVar20 + -1) {
    }
  }
  if ((int)uVar23 * 4 - iVar20 <= (int)((uVar11 ^ 0x1f) + (int)uVar39 * 4 + -0x18))
  goto LAB_004ddb7c;
LAB_004dd9f4:
  uVar30 = uVar17;
  puVar32 = puVar19;
  puVar37 = puVar19;
  uVar39 = uVar23;
  if (puVar31 <= puVar19) goto LAB_004ddb7c;
  goto LAB_004dcdb9;
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 2, ZSTD_noDict);
}